

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

KINT32 __thiscall KDIS::NETWORK::Connection::Send(Connection *this,KOCTET *Data,KUINT32 DataSz)

{
  ssize_t sVar1;
  KException *this_00;
  int *piVar2;
  KCHAR8 *__s;
  allocator<char> local_41;
  KString local_40;
  int local_20;
  KUINT32 local_1c;
  KINT32 iBytesSent;
  KUINT32 DataSz_local;
  KOCTET *Data_local;
  Connection *this_local;
  
  local_1c = DataSz;
  _iBytesSent = Data;
  Data_local = (KOCTET *)this;
  sVar1 = sendto(this->m_iSocket[0],Data,(ulong)DataSz,0,(sockaddr *)&this->m_SendToAddr,0x10);
  local_20 = (int)sVar1;
  if (local_20 == -1) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    piVar2 = __errno_location();
    __s = getErrorText(this,*piVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
    KException::KException(this_00,&local_40,0xc);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  return local_20;
}

Assistant:

KINT32 Connection::Send(const KOCTET *Data, KUINT32 DataSz) noexcept(false)
{
    KINT32 iBytesSent =  sendto( m_iSocket[SEND_SOCK], Data, DataSz, 0, ( sockaddr * )&m_SendToAddr, sizeof( m_SendToAddr ) );

    if( iBytesSent == SOCKET_ERROR )
    {
        THROW_ERROR;
    }

    return iBytesSent;
}